

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_simul.c
# Opt level: O0

int cmp_u64(void *a,void *b)

{
  uint64_t r;
  uint64_t l;
  void *b_local;
  void *a_local;
  
  if (*a < *b) {
    a_local._4_4_ = -1;
  }
  else if (*b < *a) {
    a_local._4_4_ = 1;
  }
  else {
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

static int cmp_u64(const void *a, const void *b)
{
	uint64_t l = *(uint64_t *)a;
	uint64_t r = *(uint64_t *)b;

	if (l < r)
		return -1;
	if (l > r)
		return 1;
	return 0;
}